

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O2

void __thiscall btMultiBody::setJointVelMultiDof(btMultiBody *this,int i,btScalar *qdot)

{
  uint uVar1;
  btMultibodyLink *pbVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  
  pbVar2 = (this->m_links).m_data;
  pfVar3 = (this->m_realBuf).m_data;
  uVar1 = pbVar2[i].m_dofCount;
  uVar5 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    pfVar3[pbVar2[i].m_dofOffset + (int)uVar5 + 6] = qdot[uVar5];
  }
  return;
}

Assistant:

void btMultiBody::setJointVelMultiDof(int i, btScalar *qdot)
{
	for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)
		m_realBuf[6 + m_links[i].m_dofOffset + dof] = qdot[dof];
}